

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

bool __thiscall
rlottie::internal::renderer::ShapeLayer::resolveKeyPath
          (ShapeLayer *this,LOTKeyPath *keyPath,uint32_t depth,LOTVariant *value)

{
  LOTVariant *pLVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  Layer *pLVar5;
  allocator local_79;
  LOTVariant *local_78;
  string local_70;
  string local_50;
  
  bVar2 = Layer::resolveKeyPath(&this->super_Layer,keyPath,depth,value);
  if (bVar2) {
    pLVar5 = (this->super_Layer).mLayerData;
    if ((undefined1  [16])
        ((undefined1  [16])(pLVar5->super_Group).super_Object.field_0 &
        (undefined1  [16])0x400000000000000) == (undefined1  [16])0x0) {
      pLVar5 = (Layer *)(pLVar5->super_Group).super_Object.field_0.mPtr;
    }
    local_78 = value;
    std::__cxx11::string::string((string *)&local_50,(char *)pLVar5,&local_79);
    bVar3 = LOTKeyPath::propagate(keyPath,&local_50,depth);
    std::__cxx11::string::_M_dispose();
    pLVar1 = local_78;
    if (bVar3) {
      pLVar5 = (this->super_Layer).mLayerData;
      if ((undefined1  [16])
          ((undefined1  [16])(pLVar5->super_Group).super_Object.field_0 &
          (undefined1  [16])0x400000000000000) == (undefined1  [16])0x0) {
        pLVar5 = (Layer *)(pLVar5->super_Group).super_Object.field_0.mPtr;
      }
      std::__cxx11::string::string((string *)&local_70,(char *)pLVar5,&local_79);
      uVar4 = LOTKeyPath::nextDepth(keyPath,&local_70,depth);
      std::__cxx11::string::_M_dispose();
      (*(this->mRoot->super_Object)._vptr_Object[4])(this->mRoot,keyPath,(ulong)uVar4,pLVar1);
    }
  }
  return bVar2;
}

Assistant:

bool renderer::ShapeLayer::resolveKeyPath(LOTKeyPath &keyPath, uint32_t depth,
                                          LOTVariant &value)
{
    if (renderer::Layer::resolveKeyPath(keyPath, depth, value)) {
        if (keyPath.propagate(name(), depth)) {
            uint32_t newDepth = keyPath.nextDepth(name(), depth);
            mRoot->resolveKeyPath(keyPath, newDepth, value);
        }
        return true;
    }
    return false;
}